

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
__thiscall
wabt::MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
          (wabt *this,Location *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view name;
  ElemSegmentModuleField *this_00;
  
  this_00 = (ElemSegmentModuleField *)operator_new(0xe8);
  name.data_ = (args_1->_M_dataplus)._M_p;
  name.size_ = args_1->_M_string_length;
  ElemSegmentModuleField::ElemSegmentModuleField(this_00,args,name);
  *(ElemSegmentModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}